

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

undefined8
fmt::v6::internal::vformat<wchar_t>
          (basic_string_view<wchar_t> format_str,
          basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
          args)

{
  iterator this;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  in_DL;
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *in_RSI;
  undefined8 in_RDI;
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> buffer;
  allocator<wchar_t> *in_stack_fffffffffffff778;
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *in_stack_fffffffffffff780;
  basic_string_view<wchar_t> in_stack_fffffffffffff7d0;
  allocator<wchar_t> local_819 [2049];
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *local_18;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  bStack_10;
  
  local_18 = in_RSI;
  bStack_10 = in_DL;
  std::allocator<wchar_t>::allocator();
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_>::basic_memory_buffer
            (in_stack_fffffffffffff780,in_stack_fffffffffffff778);
  std::allocator<wchar_t>::~allocator(local_819);
  this = vformat_to<wchar_t>((buffer<wchar_t> *)local_18,in_stack_fffffffffffff7d0,bStack_10);
  to_string<wchar_t,500ul>(local_18);
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_>::~basic_memory_buffer
            ((basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *)this.container);
  return in_RDI;
}

Assistant:

inline std::basic_string<Char> internal::vformat(
    basic_string_view<Char> format_str,
    basic_format_args<buffer_context<type_identity_t<Char>>> args) {
  basic_memory_buffer<Char> buffer;
  internal::vformat_to(buffer, format_str, args);
  return to_string(buffer);
}